

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_algebraic.h
# Opt level: O0

void __thiscall
mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>::AlgebraicConstraint
          (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *this,LinTerms *le,AlgConRange rr,
          bool fSort)

{
  byte in_DL;
  LinTerms *in_RSI;
  LinTerms *in_RDI;
  type in_XMM0_Qa;
  type in_XMM1_Qa;
  
  BasicConstraint::BasicConstraint((BasicConstraint *)0x1ac555);
  LinTerms::LinTerms(in_RDI,in_RSI);
  in_RDI[1].coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[1] =
       in_XMM0_Qa;
  in_RDI[1].coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[2] =
       in_XMM1_Qa;
  if ((in_DL & 1) != 0) {
    sort_terms((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *)0x1ac595);
  }
  return;
}

Assistant:

AlgebraicConstraint(Body le, RhsOrRange rr, bool fSort=true)
    : Body(std::move(le)), RhsOrRange(std::move(rr))
  { if (fSort) sort_terms(); }